

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O3

QPainterPath qt_regionToPath(QRegion *region)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  QRegionPrivate *pQVar8;
  qreal qVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  qreal *pqVar13;
  long lVar14;
  byte bVar15;
  uint uVar16;
  QRect *pQVar17;
  QRect *pQVar18;
  qreal *pqVar19;
  undefined8 uVar20;
  double dVar21;
  int iVar22;
  long *in_RSI;
  int iVar23;
  qreal *pqVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  QRect *pQVar28;
  ulong uVar29;
  undefined8 *puVar30;
  uint uVar31;
  uint uVar32;
  byte *pbVar33;
  double dVar34;
  ulong uVar35;
  long in_FS_OFFSET;
  byte local_20a4;
  byte local_20a3;
  byte local_20a2;
  byte local_20a1;
  qreal *local_2098;
  QPointF local_2068;
  QRectF local_2050 [256];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  region->d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
  QPainterPath::QPainterPath((QPainterPath *)region);
  pQVar8 = ((QRegionData *)*in_RSI)->qt_rgn;
  if (pQVar8 == (QRegionPrivate *)0x0) {
    pQVar17 = (QRect *)0x0;
    pQVar28 = (QRect *)0x0;
  }
  else {
    if ((long)pQVar8->numRects == 1) {
      if ((QRegionData *)*in_RSI == &QRegion::shared_empty) {
        lVar14 = -1;
        iVar23 = 0;
        uVar20 = 0;
      }
      else {
        uVar20._0_4_ = (pQVar8->extents).x1;
        uVar20._4_4_ = (pQVar8->extents).y1;
        lVar14._0_4_ = (pQVar8->extents).x2;
        lVar14._4_4_ = (pQVar8->extents).y2;
        iVar23 = uVar20._4_4_;
      }
      local_2050[0].xp = (qreal)(int)uVar20;
      local_2050[0].yp = (qreal)iVar23;
      local_2050[0].w = (qreal)(((long)(int)lVar14 - (long)(int)uVar20) + 1);
      local_2050[0].h = (qreal)(((lVar14 >> 0x20) - (long)iVar23) + 1);
      QPainterPath::addRect((QPainterPath *)region,local_2050);
      goto LAB_0042b2e6;
    }
    pQVar17 = (pQVar8->rects).d.ptr;
    pQVar28 = pQVar17 + pQVar8->numRects;
  }
  pqVar13 = &local_2050[0].h;
  memset(pqVar13,0xaa,0x2000);
  local_2050[0].xp = 1.26480805335359e-321;
  local_2050[0].yp = 0.0;
  dVar21 = (double)((long)pQVar28 - (long)pQVar17 >> 2);
  if (0x100 < (long)dVar21) {
    dVar34 = dVar21;
    if ((ulong)dVar21 >> 0x3b == 0) {
      uVar35 = (long)dVar21 << 5;
      local_2050[0].w = (qreal)pqVar13;
      uVar12 = QtPrivate::expectedAllocSize(uVar35,0x10);
      if (uVar12 != 0) {
        dVar34 = (double)(uVar12 >> 5);
        uVar35 = uVar12 & 0xffffffffffffffe0;
        if (uVar35 == 0) goto LAB_0042b30e;
      }
      pqVar13 = (qreal *)malloc(uVar35);
      local_2050[0].xp = dVar34;
    }
    else {
LAB_0042b30e:
      pqVar13 = (qreal *)0x0;
      local_2050[0].xp = dVar34;
    }
  }
  local_2050[0].yp = dVar21;
  local_2050[0].w = (qreal)pqVar13;
  if (pQVar17 != pQVar28) {
    iVar23 = 0;
    uVar12 = 0;
    local_2098 = (qreal *)0x0;
    uVar31 = 0;
    do {
      iVar2 = (pQVar17->y1).m_i;
      uVar32 = 0;
      pQVar18 = pQVar17;
      do {
        if ((pQVar18->y1).m_i != iVar2) break;
        uVar32 = uVar32 + 1;
        pQVar18 = pQVar18 + 1;
      } while (pQVar18 != pQVar28);
      iVar22 = (int)uVar12;
      if (uVar32 != 0) {
        local_20a1 = local_20a1 & 0xfd;
        local_20a2 = local_20a2 & 0xfd;
        local_20a3 = local_20a3 & 0xfd;
        local_20a4 = local_20a4 & 0xfd;
        lVar14 = (long)(int)uVar32;
        uVar29 = 0;
        uVar35 = uVar12;
        do {
          lVar1 = uVar29 + (long)iVar22;
          uVar20 = *(undefined8 *)(pQVar17 + uVar29);
          *(byte *)(pqVar13 + lVar1 * 4) = local_20a1;
          *(undefined8 *)((long)pqVar13 + lVar1 * 0x20 + 4) = uVar20;
          iVar3 = pQVar17[uVar29].y1.m_i;
          iVar4 = pQVar17[uVar29].x2.m_i;
          lVar25 = lVar1 + lVar14;
          *(byte *)(pqVar13 + lVar25 * 4) = local_20a2;
          *(ulong *)((long)pqVar13 + lVar25 * 0x20 + 4) = CONCAT44(iVar3,iVar4 + 1);
          uVar27._0_4_ = pQVar17[uVar29].x2;
          uVar27._4_4_ = pQVar17[uVar29].y2;
          lVar25 = lVar25 + lVar14;
          *(byte *)(pqVar13 + lVar25 * 4) = local_20a3;
          *(ulong *)((long)pqVar13 + lVar25 * 0x20 + 4) =
               ((ulong)((undefined4)uVar27 + 1) | uVar27 & 0xffffffff00000000) + 0x100000000;
          iVar3 = pQVar17[uVar29].x1.m_i;
          iVar4 = pQVar17[uVar29].y2.m_i;
          *(byte *)(pqVar13 + lVar25 * 4 + lVar14 * 4) = local_20a4;
          *(ulong *)((long)pqVar13 + lVar14 * 0x20 + 4 + lVar25 * 0x20) = CONCAT44(iVar4 + 1,iVar3);
          lVar25 = uVar35 << 5;
          lVar26 = 1;
          do {
            uVar27 = (ulong)(uVar32 * ((uint)lVar26 & 3) + (int)lVar1);
            *(qreal **)((long)pqVar13 + lVar25 + 0x18) = pqVar13 + uVar27 * 4;
            pqVar13[uVar27 * 4 + 2] = (qreal)((long)pqVar13 + lVar25);
            *(byte *)((long)pqVar13 + lVar25) =
                 *(byte *)((long)pqVar13 + lVar25) & 0xfe |
                 *(int *)((long)pqVar13 + lVar25 + 8) == *(int *)(pqVar13 + uVar27 * 4 + 1);
            lVar25 = lVar25 + (ulong)uVar32 * 0x20;
            lVar26 = lVar26 + 1;
          } while (lVar26 != 5);
          uVar29 = uVar29 + 1;
          uVar35 = (ulong)((int)uVar35 + 1);
        } while (uVar29 != uVar32);
      }
      if (((local_2098 != (qreal *)0x0) && (iVar23 == iVar2)) && (uVar32 != 0 && uVar31 != 0)) {
        uVar11 = 0;
        uVar16 = 0;
        do {
          uVar35 = (ulong)uVar11;
          uVar29 = (ulong)uVar16;
          iVar23 = *(int *)((long)local_2098 + uVar35 * 0x20 + 4);
          iVar3 = *(int *)((long)local_2098[uVar35 * 4 + 3] + 4);
          iVar4 = iVar3;
          if (iVar3 < iVar23) {
            iVar4 = iVar23;
          }
          iVar5 = *(int *)((long)pqVar13 + uVar29 * 0x20 + uVar12 * 0x20 + 4);
          qVar9 = pqVar13[uVar12 * 4 + uVar29 * 4 + 3];
          iVar6 = *(int *)((long)qVar9 + 4);
          if (iVar23 < iVar3) {
            iVar3 = iVar23;
          }
          iVar23 = iVar6;
          if (iVar6 < iVar5) {
            iVar23 = iVar5;
          }
          if (iVar5 < iVar6) {
            iVar6 = iVar5;
          }
          if ((iVar3 < iVar23) && (iVar6 < iVar4)) {
            pqVar19 = local_2098 + uVar35 * 4;
            pqVar24 = pqVar13 + uVar12 * 4 + uVar29 * 4;
            if (iVar23 < iVar4) {
              pqVar24[3] = local_2098[uVar35 * 4 + 3];
              *(qreal **)((long)pqVar19[3] + 0x10) = pqVar24;
              pqVar19[3] = qVar9;
              puVar30 = (undefined8 *)((long)qVar9 + 0x10);
            }
            else {
              uVar7 = *(undefined4 *)(pqVar24 + 1);
              lVar14 = (long)pqVar24[2];
              *(undefined8 *)((long)pqVar24 + 4) = *(undefined8 *)((long)pqVar19 + 4);
              lVar1 = (long)pqVar19[2];
              pqVar24[2] = (qreal)lVar1;
              *(qreal **)(lVar1 + 0x18) = pqVar24;
              *(int *)((long)pqVar19 + 4) = iVar5;
              *(undefined4 *)(pqVar19 + 1) = uVar7;
              pqVar19[2] = (qreal)lVar14;
              puVar30 = (undefined8 *)(lVar14 + 0x18);
            }
            *puVar30 = pqVar19;
          }
          uVar11 = uVar11 + (iVar4 <= iVar23);
        } while ((uVar11 != uVar31) && (uVar16 = uVar16 + (iVar23 <= iVar4), uVar16 != uVar32));
      }
      local_2098 = pqVar13 + (ulong)(iVar22 + uVar32 * 2) * 4;
      uVar11 = iVar22 + uVar32 * 4;
      uVar12 = (ulong)uVar11;
      iVar23 = ((iVar2 + (pQVar17->y2).m_i) - (pQVar17->y1).m_i) + 1;
      pQVar17 = pQVar18;
      uVar31 = uVar32;
    } while (pQVar18 != pQVar28);
    if (uVar11 != 0) {
      uVar35 = 0;
      do {
        if (((ulong)*(qreal *)((long)local_2050[0].w + uVar35 * 4 * 8) & 2) == 0) {
          pqVar13 = (qreal *)((long)local_2050[0].w + uVar35 * 4 * 8);
          dVar21 = (double)(int)((ulong)*(undefined8 *)((long)pqVar13 + 4) >> 0x20);
          local_2068.yp._0_4_ = SUB84(dVar21,0);
          local_2068.xp = (double)(int)*(undefined8 *)((long)pqVar13 + 4);
          local_2068.yp._4_4_ = (int)((ulong)dVar21 >> 0x20);
          QPainterPath::moveTo((QPainterPath *)region,&local_2068);
          bVar10 = *(byte *)pqVar13 | 2;
          *(byte *)pqVar13 = bVar10;
          for (pbVar33 = (byte *)pqVar13[3]; (qreal *)pbVar33 != pqVar13;
              pbVar33 = *(byte **)(pbVar33 + 0x18)) {
            bVar15 = *pbVar33;
            if (((bVar10 ^ bVar15) & 1) != 0) {
              dVar21 = (double)(int)((ulong)*(undefined8 *)(pbVar33 + 4) >> 0x20);
              local_2068.yp._0_4_ = SUB84(dVar21,0);
              local_2068.xp = (double)(int)*(undefined8 *)(pbVar33 + 4);
              local_2068.yp._4_4_ = (int)((ulong)dVar21 >> 0x20);
              QPainterPath::lineTo((QPainterPath *)region,&local_2068);
              bVar15 = *pbVar33;
            }
            bVar10 = bVar15 | 2;
            *pbVar33 = bVar10;
          }
        }
        uVar35 = uVar35 + 1;
      } while (uVar35 != uVar12);
    }
  }
  if ((qreal *)local_2050[0].w != &local_2050[0].h) {
    QtPrivate::sizedFree((void *)local_2050[0].w,(long)local_2050[0].xp << 5);
  }
LAB_0042b2e6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QExplicitlySharedDataPointer<QPainterPathPrivate>)
           (QExplicitlySharedDataPointer<QPainterPathPrivate>)region;
  }
  __stack_chk_fail();
}

Assistant:

Q_GUI_EXPORT QPainterPath qt_regionToPath(const QRegion &region)
{
    QPainterPath result;
    if (region.rectCount() == 1) {
        result.addRect(region.boundingRect());
        return result;
    }

    auto rect = region.begin();
    const auto end = region.end();

    QVarLengthArray<Segment> segments;
    segments.resize(4 * (end - rect));

    int lastRowSegmentCount = 0;
    Segment *lastRowSegments = nullptr;

    int lastSegment = 0;
    int lastY = 0;
    while (rect != end) {
        const int y = rect[0].y();
        int count = 0;
        while (&rect[count] != end && rect[count].y() == y)
            ++count;

        for (int i = 0; i < count; ++i) {
            int offset = lastSegment + i;
            segments[offset] = Segment(rect[i].topLeft());
            segments[offset += count] = Segment(rect[i].topRight() + QPoint(1, 0));
            segments[offset += count] = Segment(rect[i].bottomRight() + QPoint(1, 1));
            segments[offset += count] = Segment(rect[i].bottomLeft() + QPoint(0, 1));

            offset = lastSegment + i;
            for (int j = 0; j < 4; ++j)
                segments[offset + j * count].connect(segments[offset + ((j + 1) % 4) * count]);
        }

        if (lastRowSegments && lastY == y)
            mergeSegments(lastRowSegments, lastRowSegmentCount, &segments[lastSegment], count);

        lastRowSegments = &segments[lastSegment + 2 * count];
        lastRowSegmentCount = count;
        lastSegment += 4 * count;
        lastY = y + rect[0].height();
        rect += count;
    }

    for (int i = 0; i < lastSegment; ++i) {
        Segment *segment = &segments[i];
        if (!segment->added)
            addSegmentsToPath(segment, result);
    }

    return result;
}